

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  int iVar1;
  Job *pJVar2;
  StringPiece *pSVar3;
  char **ppcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  EmptyOp EVar9;
  uint32 uVar10;
  int iVar11;
  int iVar12;
  byte *p;
  ostream *poVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  byte *p_00;
  Inst *this_00;
  LogMessageFatal local_1b0;
  
  p = (byte *)((this->text_).ptr_ + (this->text_).length_);
  this->njob_ = 0;
  Push(this,id0,p0,0);
  bVar14 = false;
  bVar6 = false;
switchD_00139ed3_caseD_7:
  do {
    if (this->njob_ < 1) {
      return bVar14;
    }
    uVar8 = this->njob_ - 1;
    this->njob_ = uVar8;
    pJVar2 = this->job_;
    iVar12 = pJVar2[uVar8].id;
    iVar1 = pJVar2[uVar8].arg;
    p_00 = (byte *)pJVar2[uVar8].p;
    uVar16 = (ulong)iVar12;
    this_00 = this->prog_->inst_ + uVar16;
    uVar8 = this_00->out_opcode_;
    uVar18 = uVar16;
    bVar7 = bVar6;
    switch(uVar8 & 7) {
    case 0:
switchD_00139ed3_caseD_0:
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
                 0xb6);
      poVar13 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Unexpected opcode: ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,this_00->out_opcode_ & 7);
      poVar13 = std::operator<<(poVar13," arg ");
      std::ostream::operator<<(poVar13,iVar1);
      LogMessageFatal::~LogMessageFatal(&local_1b0);
      return false;
    case 1:
switchD_00139ed3_caseD_1:
      if (iVar1 == 0) {
        Push(this,(int)uVar16,(char *)p_00,1);
        bVar6 = Prog::Inst::greedy(this_00,this->prog_);
        if (bVar6) {
          iVar12 = Prog::Inst::out1(this_00);
          Push(this,iVar12,(char *)p_00,0);
          uVar8 = Prog::Inst::out1(this_00);
          uVar16 = (ulong)uVar8;
          bVar6 = true;
          p_00 = p;
        }
        else {
          Push(this,this_00->out_opcode_ >> 4,(char *)p,0);
          uVar16 = (ulong)(this_00->out_opcode_ >> 4);
          bVar6 = true;
        }
LAB_00139f9c:
        iVar12 = (int)uVar16;
        bVar7 = ShouldVisit(this,iVar12,(char *)p_00);
        if (!bVar7) break;
        uVar18 = (ulong)iVar12;
        this_00 = this->prog_->inst_ + uVar18;
        uVar8 = this_00->out_opcode_;
        bVar7 = bVar6;
        switch(uVar8 & 7) {
        case 0:
          goto switchD_00139ed3_caseD_0;
        case 1:
          goto switchD_00139ed3_caseD_1;
        case 2:
switchD_00139ed3_caseD_2:
          uVar8 = 0xffffffff;
          if (p_00 < p) {
            uVar8 = (uint)*p_00;
          }
          bVar7 = Prog::Inst::Matches(this_00,uVar8);
          if (!bVar7) goto LAB_0013a0ca;
          uVar8 = this_00->out_opcode_;
          if ((uVar8 & 8) == 0) {
            Push(this,iVar12 + 1,(char *)p_00,0);
            uVar8 = this_00->out_opcode_;
          }
          p_00 = p_00 + 1;
          break;
        case 3:
switchD_00139ed3_caseD_3:
          if (iVar1 == 0) goto code_r0x0013a13a;
          if (iVar1 == 1) {
            ppcVar4 = this->cap_;
            iVar12 = Prog::Inst::cap(this_00);
            ppcVar4[iVar12] = (char *)p_00;
          }
          else {
            LogMessageFatal::LogMessageFatal
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                       ,0xfa);
            poVar13 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                                      "Bad arg in kInstCapture: ");
            std::ostream::operator<<(poVar13,iVar1);
            LogMessageFatal::~LogMessageFatal(&local_1b0);
          }
          goto switchD_00139ed3_caseD_7;
        case 4:
switchD_00139ed3_caseD_4:
          EVar9 = Prog::Inst::empty(this_00);
          uVar10 = Prog::EmptyFlags(&this->context_,(char *)p_00);
          if ((EVar9 & ~uVar10) == 0) {
            uVar8 = this_00->out_opcode_;
            goto switchD_00139ed3_caseD_6;
          }
          goto LAB_0013a0ca;
        case 5:
switchD_00139ed3_caseD_5:
          if ((this->endmatch_ != true) ||
             (p_00 == (byte *)((this->text_).ptr_ + (this->text_).length_))) {
            uVar8 = this->nsubmatch_;
            if (uVar8 == 0) {
              return true;
            }
            this->cap_[1] = (char *)p_00;
            pSVar3 = this->submatch_;
            if ((pSVar3->ptr_ == (char *)0x0) ||
               ((bVar15 = this->longest_, (bool)bVar15 == true &&
                (pSVar3->ptr_ + pSVar3->length_ < p_00)))) {
              ppcVar4 = this->cap_;
              uVar16 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar16 = 0;
              }
              for (lVar17 = 0; uVar16 * 0x10 != lVar17; lVar17 = lVar17 + 0x10) {
                uVar5 = *(undefined8 *)((long)ppcVar4 + lVar17);
                iVar11 = *(int *)((long)ppcVar4 + lVar17 + 8);
                *(undefined8 *)((long)&pSVar3->ptr_ + lVar17) = uVar5;
                *(int *)((long)&pSVar3->length_ + lVar17) = iVar11 - (int)uVar5;
              }
              bVar15 = this->longest_;
            }
            if ((bVar15 & 1) == 0) {
              return true;
            }
            bVar14 = true;
            if (p_00 == (byte *)((this->text_).ptr_ + (this->text_).length_)) {
              return true;
            }
          }
LAB_0013a0ca:
          if (((byte)this->prog_->inst_[uVar18].out_opcode_ >> 3 & 1) != 0 || bVar6)
          goto switchD_00139ed3_caseD_7;
          uVar16 = (ulong)(iVar12 + 1);
          bVar6 = false;
          goto LAB_00139f9c;
        case 6:
switchD_00139ed3_caseD_6:
          if ((uVar8 & 8) == 0) {
            Push(this,iVar12 + 1,(char *)p_00,0);
            uVar8 = this_00->out_opcode_;
          }
          break;
        case 7:
          goto switchD_00139ed3_caseD_7;
        }
        uVar16 = (ulong)(uVar8 >> 4);
        goto LAB_00139f9c;
      }
      bVar6 = false;
      if (iVar1 != 1) {
        LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                   ,0xd4);
        poVar13 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                                  "Bad arg in kInstAltMatch: ");
        std::ostream::operator<<(poVar13,iVar1);
        LogMessageFatal::~LogMessageFatal(&local_1b0);
        bVar6 = bVar7;
      }
      break;
    case 2:
      goto switchD_00139ed3_caseD_2;
    case 3:
      goto switchD_00139ed3_caseD_3;
    case 4:
      goto switchD_00139ed3_caseD_4;
    case 5:
      goto switchD_00139ed3_caseD_5;
    case 6:
      goto switchD_00139ed3_caseD_6;
    }
  } while( true );
code_r0x0013a13a:
  if ((uVar8 & 8) == 0) {
    Push(this,iVar12 + 1,(char *)p_00,0);
  }
  iVar11 = Prog::Inst::cap(this_00);
  if ((-1 < iVar11) && (iVar11 = Prog::Inst::cap(this_00), iVar11 < this->ncap_)) {
    ppcVar4 = this->cap_;
    iVar11 = Prog::Inst::cap(this_00);
    Push(this,iVar12,ppcVar4[iVar11],1);
    ppcVar4 = this->cap_;
    iVar12 = Prog::Inst::cap(this_00);
    ppcVar4[iVar12] = (char *)p_00;
  }
  uVar16 = (ulong)(this_00->out_opcode_ >> 4);
  goto LAB_00139f9c;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  bool inaltmatch = false;
  const char* end = text_.end();
  njob_ = 0;
  Push(id0, p0, 0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    const char* p = job_[njob_].p;
    int arg = job_[njob_].arg;

    // Optimization: rather than push and pop,
    // code that is going to Push and continue
    // the loop simply updates ip, p, and arg
    // and jumps to CheckAndLoop.  We have to
    // do the ShouldVisit check that Push
    // would have, but we avoid the stack
    // manipulation.
    if (0) {
    Next:
      // If the Match of a non-greedy AltMatch failed,
      // we stop ourselves from trying the ByteRange,
      // which would steer us off the short circuit.
      if (prog_->inst(id)->last() || inaltmatch)
        continue;
      id++;

    CheckAndLoop:
      if (!ShouldVisit(id, p))
        continue;
    }

    // Visit ip, p.
    // VLOG(0) << "Job: " << ip->id() << " "
    //         << (p - text_.begin()) << " " << arg;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode() << " arg " << arg;
        return false;

      case kInstFail:
        continue;

      case kInstAltMatch:
        switch (arg) {
          case 0:
            inaltmatch = true;
            Push(id, p, 1);  // come back when we're done

            // One opcode is ByteRange; the other leads to Match
            // (possibly via Nop or Capture).
            if (ip->greedy(prog_)) {
              // out1 is the match
              Push(ip->out1(), p, 0);
              id = ip->out1();
              p = end;
              goto CheckAndLoop;
            }
            // out is the match - non-greedy
            Push(ip->out(), end, 0);
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            inaltmatch = false;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstAltMatch: " << arg;
        continue;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        switch (arg) {
          case 0:
            if (!ip->last())
              Push(id+1, p, 0);  // try the next when we're done

            if (0 <= ip->cap() && ip->cap() < ncap_) {
              // Capture p to register, but save old value.
              Push(id, cap_[ip->cap()], 1);  // come back when we're done
              cap_[ip->cap()] = p;
            }

            // Continue on.
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            // Finished ip->out(); restore the old value.
            cap_[ip->cap()] = p;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstCapture: " << arg;
        continue;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstMatch: {
        if (endmatch_ && p != text_.end())
          goto Next;

        // VLOG(0) << "Found match.";
        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].end())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i].set(cap_[2*i],
                             static_cast<int>(cap_[2*i+1] - cap_[2*i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == text_.end())
          return true;

        // Otherwise, continue on in hope of a longer match.
        goto Next;
      }
    }
  }
  return matched;
}